

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

linked_ptr<testing::ActionInterface<test_result_(bool)>_> * __thiscall
testing::internal::linked_ptr<testing::ActionInterface<test_result_(bool)>_>::operator=
          (linked_ptr<testing::ActionInterface<test_result_(bool)>_> *this,
          linked_ptr<testing::ActionInterface<test_result_(bool)>_> *ptr)

{
  linked_ptr<testing::ActionInterface<test_result_(bool)>_> *in_RSI;
  linked_ptr<testing::ActionInterface<test_result_(bool)>_> *in_RDI;
  
  if (in_RSI != in_RDI) {
    depart(in_RSI);
    linked_ptr<testing::ActionInterface<test_result(bool)>>::
    copy<testing::ActionInterface<test_result(bool)>>(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }